

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

int Acb_NtkEcoPerform(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG,char **pFileName,int fCisOnly,int fInputs,
                     int fCheck,int fVerbose,int fVeryVerbose)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  Acb_Ntk_t *p;
  char **ppcVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Vec_Int_t *vDivs;
  Vec_Int_t *pVVar13;
  Vec_Int_t *pVVar14;
  Gia_Man_t *pGVar15;
  Gia_Man_t *pGVar16;
  Vec_Ptr_t *vSops;
  void **ppvVar17;
  Vec_Wec_t *vSupps;
  Vec_Int_t *pVVar18;
  Vec_Ptr_t *vGias;
  Cnf_Dat_t *pCVar19;
  sat_solver *s;
  Vec_Ptr_t *vSops_00;
  Vec_Str_t *p_00;
  int iVar20;
  int *piVar21;
  int *piVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  int *piVar26;
  long lVar27;
  uint uVar28;
  size_t sVar29;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Gia_Man_t *local_100;
  Vec_Str_t *local_f8;
  int local_e0;
  Vec_Int_t *vUsed;
  timespec ts;
  long local_b0;
  int Lit;
  Vec_Int_t *local_80;
  Gia_Man_t *local_78;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  Acb_Ntk_t *local_60;
  Vec_Bit_t *local_58;
  char **local_50;
  Gia_Man_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_50 = pFileName;
  iVar8 = clock_gettime(3,(timespec *)&ts);
  if (iVar8 < 0) {
    local_b0 = -1;
  }
  else {
    local_b0 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  local_80 = &pNtkF->vTargets;
  uVar3 = (pNtkF->vTargets).nSize;
  pVVar10 = Acb_NtkFindRoots(pNtkF,local_80,&local_58);
  pVVar11 = Acb_NtkFindSupp(pNtkF,pVVar10);
  local_70 = pVVar10;
  pVVar10 = Acb_NtkFindSupp(pNtkG,pVVar10);
  iVar8 = pVVar11->nSize;
  iVar25 = pVVar10->nSize;
  local_68 = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < (iVar25 + iVar8) - 1U) {
    iVar20 = iVar25 + iVar8;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar20;
  if (iVar20 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc((long)iVar20 << 2);
  }
  pVVar11->pArray = piVar12;
  piVar26 = local_68->pArray;
  piVar22 = pVVar10->pArray;
  piVar1 = piVar26 + iVar8;
  piVar2 = piVar22 + iVar25;
  piVar21 = piVar12;
  if ((0 < iVar8) && (0 < iVar25)) {
    do {
      iVar8 = *piVar26;
      iVar25 = *piVar22;
      if (iVar8 == iVar25) {
        piVar26 = piVar26 + 1;
        *piVar21 = iVar8;
        piVar22 = piVar22 + 1;
      }
      else if (iVar8 < iVar25) {
        piVar26 = piVar26 + 1;
        *piVar21 = iVar8;
      }
      else {
        piVar22 = piVar22 + 1;
        *piVar21 = iVar25;
      }
      piVar21 = piVar21 + 1;
    } while ((piVar26 < piVar1) && (piVar22 < piVar2));
  }
  for (; piVar26 < piVar1; piVar26 = piVar26 + 1) {
    *piVar21 = *piVar26;
    piVar21 = piVar21 + 1;
  }
  for (; piVar22 < piVar2; piVar22 = piVar22 + 1) {
    *piVar21 = *piVar22;
    piVar21 = piVar21 + 1;
  }
  iVar8 = (int)((ulong)((long)piVar21 - (long)piVar12) >> 2);
  pVVar11->nSize = iVar8;
  if (pVVar11->nCap < iVar8) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x740,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar8 < local_68->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x741,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar8 < pVVar10->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x742,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (fInputs == 0 && fCisOnly == 0) {
    vDivs = Acb_NtkFindDivs(pNtkF,pVVar11,local_58,fVerbose);
  }
  else {
    vDivs = Acb_NtkFindDivsCis(pNtkF,pVVar11);
  }
  pVVar18 = local_70;
  pVVar13 = Acb_NtkFindNodes(pNtkF,local_70,vDivs);
  pVVar14 = Acb_NtkFindNodes(pNtkG,pVVar18,(Vec_Int_t *)0x0);
  local_60 = pNtkF;
  local_40 = pVVar13;
  pGVar15 = Acb_NtkToGia(pNtkF,pVVar11,pVVar13,pVVar18,vDivs,local_80);
  local_38 = pVVar14;
  pGVar16 = Acb_NtkToGia(pNtkG,pVVar11,pVVar14,pVVar18,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  local_78 = pGVar15;
  local_100 = Acb_CreateMiter(pGVar15,pGVar16);
  vSops = (Vec_Ptr_t *)malloc(0x10);
  ppvVar17 = (void **)0x0;
  uVar28 = 8;
  if (6 < uVar3 - 1) {
    uVar28 = uVar3;
  }
  vSops->nSize = 0;
  vSops->nCap = uVar28;
  sVar29 = (size_t)(int)uVar28;
  if (uVar28 != 0) {
    ppvVar17 = (void **)malloc(sVar29 * 8);
  }
  vSops->pArray = ppvVar17;
  vSupps = (Vec_Wec_t *)malloc(0x10);
  vSupps->nSize = 0;
  vSupps->nCap = uVar28;
  if (uVar28 == 0) {
    pVVar18 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar18 = (Vec_Int_t *)calloc(sVar29,0x10);
  }
  vSupps->pArray = pVVar18;
  pVVar18 = (Vec_Int_t *)malloc(0x10);
  pVVar18->nCap = 100;
  pVVar18->nSize = 0;
  piVar12 = (int *)malloc(400);
  pVVar18->pArray = piVar12;
  vUsed = (Vec_Int_t *)0x0;
  if (fCisOnly == 0) {
    vGias = (Vec_Ptr_t *)0x0;
  }
  else {
    vGias = (Vec_Ptr_t *)malloc(0x10);
    vGias->nSize = 0;
    vGias->nCap = uVar28;
    if (uVar28 == 0) {
      ppvVar17 = (void **)0x0;
    }
    else {
      ppvVar17 = (void **)malloc(sVar29 << 3);
    }
    vGias->pArray = ppvVar17;
  }
  if (fVerbose != 0) {
    printf("The number of targets = %d.\n");
    printf("NtkF:  ");
    Gia_ManPrintStats(local_78,(Gps_Par_t *)0x0);
    printf("NtkG:  ");
    Gia_ManPrintStats(pGVar16,(Gps_Par_t *)0x0);
    printf("Miter: ");
    Gia_ManPrintStats(local_100,(Gps_Par_t *)0x0);
  }
  local_48 = pGVar16;
  if (fCheck == 0) {
LAB_0039f4e0:
    uVar23 = (ulong)uVar3;
    if (0 < (int)uVar3) {
      do {
        iVar8 = (int)uVar23;
        uVar28 = iVar8 - 1;
        printf("\nConsidering target %d (out of %d)...\n",(ulong)uVar28,(ulong)uVar3);
        if (fCisOnly == 0) {
          pCVar19 = Acb_NtkDeriveMiterCnf(local_100,uVar28,uVar3,fVerbose);
          uVar23 = (ulong)(uint)vDivs->nSize;
          pVVar13 = Acb_DerivePatchSupport
                              (pCVar19,uVar28,uVar3,vDivs->nSize,vDivs,local_60,pVVar18,0x78);
          if (pVVar13 == (Vec_Int_t *)0x0) {
            Cnf_DataFree(pCVar19);
            local_f8 = (Vec_Str_t *)0x0;
            p_00 = (Vec_Str_t *)0x0;
            vSops_00 = (Vec_Ptr_t *)0x0;
            local_e0 = 0;
            goto LAB_0039fe2b;
          }
          if (0 < pVVar13->nSize) {
            lVar27 = 0;
            do {
              Vec_IntPush(pVVar18,pVVar13->pArray[lVar27]);
              lVar27 = lVar27 + 1;
            } while (lVar27 < pVVar13->nSize);
          }
          iVar25 = (int)uVar23;
          pVVar13->nSize = 0;
          if (0 < pVVar18->nSize) {
            lVar27 = 0;
            do {
              Vec_IntPush(pVVar13,pVVar18->pArray[lVar27]);
              iVar25 = (int)uVar23;
              lVar27 = lVar27 + 1;
            } while (lVar27 < pVVar18->nSize);
          }
          pcVar24 = Acb_DeriveOnePatchFunction(pCVar19,uVar28,uVar3,iVar25,pVVar13,0);
          Cnf_DataFree(pCVar19);
          if (pcVar24 == (char *)0x0) {
            local_e0 = 0;
            local_f8 = (Vec_Str_t *)0x0;
            p_00 = (Vec_Str_t *)0x0;
            vSops_00 = (Vec_Ptr_t *)0x0;
            goto LAB_0039fe2b;
          }
          pGVar15 = Abc_SopSynthesizeOne(pcVar24,1);
          printf("Tar%02d: ");
          Gia_ManPrintStats(pGVar15,(Gps_Par_t *)0x0);
          pGVar16 = Acb_UpdateMiter(local_100,pGVar15,uVar28,uVar3,pVVar13,0);
          Gia_ManStop(local_100);
          Gia_ManStop(pGVar15);
          uVar4 = vSops->nSize;
          if (uVar4 == vSops->nCap) {
            if ((int)uVar4 < 0x10) {
              if (vSops->pArray == (void **)0x0) {
                ppvVar17 = (void **)malloc(0x80);
              }
              else {
                ppvVar17 = (void **)realloc(vSops->pArray,0x80);
              }
              vSops->pArray = ppvVar17;
              vSops->nCap = 0x10;
            }
            else {
              if (vSops->pArray == (void **)0x0) {
                ppvVar17 = (void **)malloc((ulong)uVar4 << 4);
              }
              else {
                ppvVar17 = (void **)realloc(vSops->pArray,(ulong)uVar4 << 4);
              }
              vSops->pArray = ppvVar17;
              vSops->nCap = uVar4 * 2;
            }
          }
          else {
            ppvVar17 = vSops->pArray;
          }
          vSops->nSize = uVar4 + 1;
          ppvVar17[(int)uVar4] = pcVar24;
          local_100 = pGVar16;
          if (fVeryVerbose != 0) {
            printf("Function %d\n%s");
          }
        }
        else {
          uVar4 = vDivs->nSize;
          pVVar13 = (Vec_Int_t *)malloc(0x10);
          uVar9 = uVar4;
          if (uVar4 - 1 < 0xf) {
            uVar9 = 0x10;
          }
          pVVar13->nCap = uVar9;
          if (uVar9 == 0) {
            piVar12 = (int *)0x0;
          }
          else {
            piVar12 = (int *)malloc((long)(int)uVar9 << 2);
          }
          auVar6 = _DAT_0094e250;
          pVVar13->pArray = piVar12;
          pVVar13->nSize = uVar4;
          if (0 < (int)uVar4) {
            lVar27 = (ulong)uVar4 - 1;
            auVar32._8_4_ = (int)lVar27;
            auVar32._0_8_ = lVar27;
            auVar32._12_4_ = (int)((ulong)lVar27 >> 0x20);
            auVar32 = auVar32 ^ auVar6;
            uVar23 = 0;
            auVar35 = _DAT_0094e240;
            do {
              auVar34 = auVar35 ^ auVar6;
              if ((bool)(~(auVar32._4_4_ < auVar34._4_4_ ||
                          auVar32._0_4_ < auVar34._0_4_ && auVar34._4_4_ == auVar32._4_4_) & 1)) {
                piVar12[uVar23] = (int)uVar23;
              }
              if (auVar34._12_4_ <= auVar32._12_4_ &&
                  (auVar34._8_4_ <= auVar32._8_4_ || auVar34._12_4_ != auVar32._12_4_)) {
                piVar12[uVar23 + 1] = (int)uVar23 + 1;
              }
              uVar23 = uVar23 + 2;
              lVar27 = auVar35._8_8_;
              auVar35._0_8_ = auVar35._0_8_ + 2;
              auVar35._8_8_ = lVar27 + 2;
            } while ((uVar4 + 1 & 0xfffffffe) != uVar23);
          }
          printf("Target %d has support with %d variables.\n",(ulong)uVar28,(ulong)uVar4);
          pGVar15 = Acb_NtkDeriveMiterCnfInter(local_100,uVar28,uVar3);
          printf("Tar%02d: ");
          Gia_ManPrintStats(pGVar15,(Gps_Par_t *)0x0);
          pGVar16 = Acb_UpdateMiter(local_100,pGVar15,uVar28,uVar3,pVVar13,fCisOnly);
          Gia_ManStop(local_100);
          uVar4 = vGias->nSize;
          if (uVar4 == vGias->nCap) {
            if ((int)uVar4 < 0x10) {
              if (vGias->pArray == (void **)0x0) {
                ppvVar17 = (void **)malloc(0x80);
              }
              else {
                ppvVar17 = (void **)realloc(vGias->pArray,0x80);
              }
              vGias->pArray = ppvVar17;
              vGias->nCap = 0x10;
            }
            else {
              if (vGias->pArray == (void **)0x0) {
                ppvVar17 = (void **)malloc((ulong)uVar4 << 4);
              }
              else {
                ppvVar17 = (void **)realloc(vGias->pArray,(ulong)uVar4 << 4);
              }
              vGias->pArray = ppvVar17;
              vGias->nCap = uVar4 * 2;
            }
          }
          else {
            ppvVar17 = vGias->pArray;
          }
          iVar25 = vGias->nSize;
          vGias->nSize = iVar25 + 1;
          ppvVar17[iVar25] = pGVar15;
          local_100 = pGVar16;
        }
        uVar4 = vSupps->nSize;
        if (uVar4 == vSupps->nCap) {
          if ((int)uVar4 < 0x10) {
            if (vSupps->pArray == (Vec_Int_t *)0x0) {
              pVVar14 = (Vec_Int_t *)malloc(0x100);
            }
            else {
              pVVar14 = (Vec_Int_t *)realloc(vSupps->pArray,0x100);
            }
            vSupps->pArray = pVVar14;
            pVVar14 = pVVar14 + (int)uVar4;
            iVar25 = 0x10;
            uVar9 = 0x10 - uVar4;
          }
          else {
            sVar29 = (ulong)uVar4 << 5;
            if (vSupps->pArray == (Vec_Int_t *)0x0) {
              pVVar14 = (Vec_Int_t *)malloc(sVar29);
            }
            else {
              pVVar14 = (Vec_Int_t *)realloc(vSupps->pArray,sVar29);
            }
            iVar25 = uVar4 * 2;
            vSupps->pArray = pVVar14;
            pVVar14 = pVVar14 + uVar4;
            uVar9 = uVar4;
          }
          memset(pVVar14,0,(ulong)uVar9 << 4);
          vSupps->nCap = iVar25;
        }
        vSupps->nSize = uVar4 + 1;
        if ((int)uVar4 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        if (0 < pVVar13->nSize) {
          pVVar14 = vSupps->pArray;
          lVar27 = 0;
          do {
            Vec_IntPush(pVVar14 + ((ulong)(uVar4 + 1) - 1),pVVar13->pArray[lVar27]);
            lVar27 = lVar27 + 1;
          } while (lVar27 < pVVar13->nSize);
        }
        if (pVVar13->pArray != (int *)0x0) {
          free(pVVar13->pArray);
        }
        free(pVVar13);
        uVar23 = (ulong)uVar28;
      } while (1 < iVar8);
    }
    putchar(10);
    if (fCisOnly == 0) {
      iVar8 = clock_gettime(3,(timespec *)&ts);
      if (iVar8 < 0) {
        lVar27 = 1;
      }
      else {
        lVar27 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        lVar27 = ((lVar27 >> 7) - (lVar27 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      pCVar19 = (Cnf_Dat_t *)Mf_ManGenerateCnf(local_100,8,0,0,0,0);
      iVar8 = Acb_CheckMiter(pCVar19);
      Cnf_DataFree(pCVar19);
      pcVar24 = "The ECO solution was verified successfully.  ";
      if (iVar8 == 0) {
        pcVar24 = "The ECO solution verification FAILED.  ";
      }
      printf(pcVar24);
      iVar25 = 3;
      iVar8 = clock_gettime(3,(timespec *)&ts);
      if (iVar8 < 0) {
        lVar30 = -1;
      }
      else {
        lVar30 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      Abc_Print(iVar25,"%s =","Time");
      Abc_Print(iVar25,"%9.2f sec\n",(double)(lVar30 + lVar27) / 1000000.0);
      vSops_00 = Acb_TransformPatchFunctions(vSops,vSupps,&vUsed,vDivs->nSize);
      uVar3 = vSops_00->nSize;
      lVar27 = (long)(int)uVar3;
      if (1 < lVar27) {
        uVar23 = 0;
        do {
          lVar27 = lVar27 + -1;
          ppvVar17 = vSops_00->pArray;
          pvVar5 = ppvVar17[uVar23];
          ppvVar17[uVar23] = ppvVar17[lVar27];
          vSops_00->pArray[lVar27] = pvVar5;
          uVar23 = uVar23 + 1;
        } while (uVar3 >> 1 != uVar23);
      }
    }
    else {
      uVar3 = vDivs->nSize;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      uVar28 = 0x10;
      if (0xe < uVar3 - 1) {
        uVar28 = uVar3;
      }
      pVVar13->nCap = uVar28;
      if (uVar28 == 0) {
        piVar12 = (int *)0x0;
      }
      else {
        piVar12 = (int *)malloc((long)(int)uVar28 << 2);
      }
      pVVar13->pArray = piVar12;
      pVVar13->nSize = uVar3;
      auVar6 = _DAT_0094e250;
      if (0 < (int)uVar3) {
        lVar27 = (ulong)uVar3 - 1;
        auVar33._8_4_ = (int)lVar27;
        auVar33._0_8_ = lVar27;
        auVar33._12_4_ = (int)((ulong)lVar27 >> 0x20);
        uVar23 = 0;
        auVar33 = auVar33 ^ _DAT_0094e250;
        auVar34 = _DAT_0094e240;
        do {
          auVar35 = auVar34 ^ auVar6;
          if ((bool)(~(auVar35._4_4_ == auVar33._4_4_ && auVar33._0_4_ < auVar35._0_4_ ||
                      auVar33._4_4_ < auVar35._4_4_) & 1)) {
            piVar12[uVar23] = (int)uVar23;
          }
          if ((auVar35._12_4_ != auVar33._12_4_ || auVar35._8_4_ <= auVar33._8_4_) &&
              auVar35._12_4_ <= auVar33._12_4_) {
            piVar12[uVar23 + 1] = (int)uVar23 + 1;
          }
          uVar23 = uVar23 + 2;
          lVar27 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 2;
          auVar34._8_8_ = lVar27 + 2;
        } while ((uVar3 + 1 & 0xfffffffe) != uVar23);
      }
      uVar3 = vGias->nSize;
      lVar27 = (long)(int)uVar3;
      vUsed = pVVar13;
      if (lVar27 < 2) {
        vSops_00 = (Vec_Ptr_t *)0x0;
      }
      else {
        vSops_00 = (Vec_Ptr_t *)0x0;
        uVar23 = 0;
        do {
          lVar27 = lVar27 + -1;
          ppvVar17 = vGias->pArray;
          pvVar5 = ppvVar17[uVar23];
          ppvVar17[uVar23] = ppvVar17[lVar27];
          vGias->pArray[lVar27] = pvVar5;
          uVar23 = uVar23 + 1;
        } while (uVar3 >> 1 != uVar23);
      }
    }
    p = local_60;
    pVVar14 = local_80;
    pVVar13 = vUsed;
    local_f8 = Acb_GenerateInstance(local_60,vDivs,vUsed,local_80);
    p_00 = Acb_GeneratePatch(p,vDivs,pVVar13,vSops_00,vGias,pVVar14);
    Acb_PrintPatch(p,vDivs,pVVar13,local_b0);
    ppcVar7 = local_50;
    pcVar24 = local_50[3];
    if (pcVar24 == (char *)0x0) {
      Acb_GenerateFilePatch(p_00,"patch.v");
      pcVar24 = ppcVar7[3];
    }
    if (pcVar24 == (char *)0x0) {
      pcVar24 = "out.v";
    }
    Acb_GenerateFileOut(local_f8,*ppcVar7,pcVar24,p_00);
    pcVar24 = ppcVar7[3];
    if (pcVar24 == (char *)0x0) {
      pcVar24 = "out.v";
    }
    printf("Finished dumping resulting file \"%s\".\n\n",pcVar24);
    local_e0 = 1;
  }
  else {
    pCVar19 = Acb_NtkDeriveMiterCnf(local_100,uVar3,uVar3,fVerbose);
    s = (sat_solver *)Cnf_DataWriteIntoSolver(pCVar19,1,0);
    Cnf_DataFree(pCVar19);
    Lit = 2;
    iVar8 = sat_solver_addclause(s,&Lit,(lit *)&local_80);
    if (iVar8 == 0) {
      sat_solver_delete(s);
      pcVar24 = "a";
      bVar31 = true;
    }
    else {
      iVar8 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      sat_solver_delete(s);
      bVar31 = iVar8 == -1;
      pcVar24 = "NO";
      if (bVar31) {
        pcVar24 = "a";
      }
    }
    local_e0 = 0;
    printf("The ECO problem has %s solution. ",pcVar24);
    iVar25 = 3;
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar25,"%s =","Time");
    Abc_Print(iVar25,"%9.2f sec\n",(double)(lVar27 - local_b0) / 1000000.0);
    if (bVar31) goto LAB_0039f4e0;
    local_f8 = (Vec_Str_t *)0x0;
    p_00 = (Vec_Str_t *)0x0;
    vSops_00 = (Vec_Ptr_t *)0x0;
  }
LAB_0039fe2b:
  if (vGias != (Vec_Ptr_t *)0x0) {
    if (0 < vGias->nSize) {
      lVar27 = 0;
      do {
        Gia_ManStop((Gia_Man_t *)vGias->pArray[lVar27]);
        lVar27 = lVar27 + 1;
      } while (lVar27 < vGias->nSize);
    }
    if (vGias->pArray != (void **)0x0) {
      free(vGias->pArray);
    }
    free(vGias);
  }
  if (p_00 != (Vec_Str_t *)0x0) {
    if (p_00->pArray != (char *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
  }
  if (local_f8 != (Vec_Str_t *)0x0) {
    if (local_f8->pArray != (char *)0x0) {
      free(local_f8->pArray);
    }
    free(local_f8);
  }
  iVar8 = vSops->nSize;
  ppvVar17 = vSops->pArray;
  if ((long)iVar8 < 1) {
    if (ppvVar17 != (void **)0x0) goto LAB_0039fee1;
  }
  else {
    lVar27 = 0;
    do {
      if ((void *)0x2 < ppvVar17[lVar27]) {
        free(ppvVar17[lVar27]);
      }
      lVar27 = lVar27 + 1;
    } while (iVar8 != lVar27);
LAB_0039fee1:
    free(ppvVar17);
  }
  free(vSops);
  iVar8 = vSupps->nCap;
  pVVar13 = vSupps->pArray;
  if ((long)iVar8 < 1) {
    if (pVVar13 == (Vec_Int_t *)0x0) goto LAB_0039ff37;
  }
  else {
    lVar27 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar13->pArray + lVar27);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        *(undefined8 *)((long)&pVVar13->pArray + lVar27) = 0;
      }
      lVar27 = lVar27 + 0x10;
    } while ((long)iVar8 * 0x10 != lVar27);
  }
  free(pVVar13);
LAB_0039ff37:
  free(vSupps);
  if (pVVar18->pArray != (int *)0x0) {
    free(pVVar18->pArray);
  }
  free(pVVar18);
  pVVar13 = local_68;
  pVVar18 = vUsed;
  if (vUsed != (Vec_Int_t *)0x0) {
    if (vUsed->pArray != (int *)0x0) {
      free(vUsed->pArray);
    }
    free(pVVar18);
    vUsed = (Vec_Int_t *)0x0;
  }
  if (vSops_00 != (Vec_Ptr_t *)0x0) {
    iVar8 = vSops_00->nSize;
    if (0 < iVar8) {
      lVar27 = 0;
      do {
        if ((void *)0x2 < vSops_00->pArray[lVar27]) {
          free(vSops_00->pArray[lVar27]);
          iVar8 = vSops_00->nSize;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < iVar8);
    }
    if (vSops_00->pArray != (void **)0x0) {
      free(vSops_00->pArray);
    }
    free(vSops_00);
  }
  Gia_ManStop(local_78);
  Gia_ManStop(local_48);
  Gia_ManStop(local_100);
  pVVar14 = local_38;
  pVVar18 = local_70;
  if (pVVar13 != (Vec_Int_t *)0x0) {
    if (pVVar13->pArray != (int *)0x0) {
      free(pVVar13->pArray);
    }
    free(pVVar13);
  }
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
    }
    free(pVVar10);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  pVVar10 = local_40;
  if (local_40 != (Vec_Int_t *)0x0) {
    if (local_40->pArray != (int *)0x0) {
      free(local_40->pArray);
    }
    free(pVVar10);
  }
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
    }
    free(pVVar14);
  }
  if (pVVar18 != (Vec_Int_t *)0x0) {
    if (pVVar18->pArray != (int *)0x0) {
      free(pVVar18->pArray);
    }
    free(pVVar18);
  }
  if (vDivs != (Vec_Int_t *)0x0) {
    if (vDivs->pArray != (int *)0x0) {
      free(vDivs->pArray);
    }
    free(vDivs);
  }
  if (local_58 != (Vec_Bit_t *)0x0) {
    if (local_58->pArray != (int *)0x0) {
      free(local_58->pArray);
    }
    free(local_58);
  }
  return local_e0;
}

Assistant:

int Acb_NtkEcoPerform( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG, char * pFileName[4], int fCisOnly, int fInputs, int fCheck, int fVerbose, int fVeryVerbose )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );

    abctime clk  = Abc_Clock();
    int nTargets = Vec_IntSize(&pNtkF->vTargets);
    int TimeOut  = fCisOnly ? 0 : 120;  // 60 seconds
    int RetValue = 1;

    // compute various sets of nodes
    Vec_Bit_t * vBlock;
    Vec_Int_t * vRoots  = Acb_NtkFindRoots( pNtkF, &pNtkF->vTargets, &vBlock );
    Vec_Int_t * vSuppF  = Acb_NtkFindSupp( pNtkF, vRoots );
    Vec_Int_t * vSuppG  = Acb_NtkFindSupp( pNtkG, vRoots );
    Vec_Int_t * vSupp   = Vec_IntTwoMerge( vSuppF, vSuppG );
    Vec_Int_t * vDivs   = (fCisOnly || fInputs) ? Acb_NtkFindDivsCis( pNtkF, vSupp ) : Acb_NtkFindDivs( pNtkF, vSupp, vBlock, fVerbose );
    Vec_Int_t * vNodesF = Acb_NtkFindNodes( pNtkF, vRoots, vDivs );
    Vec_Int_t * vNodesG = Acb_NtkFindNodes( pNtkG, vRoots, NULL );

    // create AIGs
    Gia_Man_t * pGiaF   = Acb_NtkToGia( pNtkF, vSupp, vNodesF, vRoots, vDivs, &pNtkF->vTargets );
    Gia_Man_t * pGiaG   = Acb_NtkToGia( pNtkG, vSupp, vNodesG, vRoots, NULL, NULL );
    Gia_Man_t * pGiaM   = Acb_CreateMiter( pGiaF, pGiaG );

    Cnf_Dat_t * pCnf;
    Gia_Man_t * pTemp, * pOne;
    Vec_Ptr_t * vSops    = Vec_PtrAlloc( nTargets );
    Vec_Wec_t * vSupps   = Vec_WecAlloc( nTargets );
    Vec_Int_t * vSuppOld = Vec_IntAlloc( 100 );

    Vec_Int_t * vUsed  = NULL; 
    Vec_Ptr_t * vFuncs = NULL;
    Vec_Ptr_t * vGias  = fCisOnly ? Vec_PtrAlloc(nTargets) : NULL;
    Vec_Str_t * vInst  = NULL, * vPatch = NULL;

    char * pSop = NULL;
    int i;

    if ( fVerbose )
    {
        printf( "The number of targets = %d.\n", nTargets );

        printf( "NtkF:  " );
        Gia_ManPrintStats( pGiaF, NULL );
        printf( "NtkG:  " );
        Gia_ManPrintStats( pGiaG, NULL );
        printf( "Miter: " );
        Gia_ManPrintStats( pGiaM, NULL );
    }

    // check that the problem has a solution
    if ( fCheck )//fCisOnly )
    {
        int Lit, status;
        sat_solver * pSat;
        pCnf = Acb_NtkDeriveMiterCnf( pGiaM, nTargets, nTargets, fVerbose );
        pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        Cnf_DataFree( pCnf );
        // add output clause
        Lit = Abc_Var2Lit( 1, 0 );
        status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        status = status == 0 ? l_False : sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        sat_solver_delete( pSat );
        printf( "The ECO problem has %s solution. ", status == l_False ? "a" : "NO" );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( status != l_False )
        {
            RetValue = 0;
            goto cleanup;
        }
    }

    for ( i = nTargets-1; i >= 0; i-- )
    {
        Vec_Int_t * vSupp = NULL;
        printf( "\nConsidering target %d (out of %d)...\n", i, nTargets );
        // compute support of this target
        if ( fCisOnly )
        {
            vSupp = Vec_IntStartNatural( Vec_IntSize(vDivs) );
            printf( "Target %d has support with %d variables.\n", i, Vec_IntSize(vSupp) );

            pOne = Acb_NtkDeriveMiterCnfInter( pGiaM, i, nTargets );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );

            // add to functions
            Vec_PtrPush( vGias, pOne );
        }
        else
        {
            pCnf = Acb_NtkDeriveMiterCnf( pGiaM, i, nTargets, fVerbose );
//            vSupp = Acb_DerivePatchSupportS( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, NULL, TimeOut );
            vSupp = Acb_DerivePatchSupport( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, vSuppOld, TimeOut );
            if ( vSupp == NULL )
            {
                Cnf_DataFree( pCnf );
                RetValue = 0;
                goto cleanup;
            }
            Vec_IntAppend( vSuppOld, vSupp );
            Vec_IntClear( vSupp );
            Vec_IntAppend( vSupp, vSuppOld );
            //Vec_IntClear( vSuppOld );

            // derive function of this target
            pSop  = Acb_DeriveOnePatchFunction( pCnf, i, nTargets, Vec_IntSize(vDivs), vSupp, fCisOnly );
            Cnf_DataFree( pCnf );
            if ( pSop == NULL )
            {
                RetValue = 0;
                goto cleanup;
            }

            // add new function to the miter
            pOne  = Abc_SopSynthesizeOne( pSop, 1 );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );
            Gia_ManStop( pOne );

            // add to functions
            Vec_PtrPush( vSops, pSop );
            if ( fVeryVerbose )
                printf( "Function %d\n%s", i, pSop );
        }
        // add to supports
        Vec_IntAppend( Vec_WecPushLevel(vSupps), vSupp );
        Vec_IntFree( vSupp );
    }

    // make sure the function is UNSAT
    printf( "\n" );
    if ( !fCisOnly )
    {
        int Res;
        abctime clk  = Abc_Clock();
        pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGiaM, 8, 0, 0, 0, 0 );
        Res = Acb_CheckMiter( pCnf );
        Cnf_DataFree( pCnf );
        if ( Res == 1 )
            printf( "The ECO solution was verified successfully.  " );
        else
            printf( "The ECO solution verification FAILED.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }

    // derive new patch functions
    if ( fCisOnly )
    {
        vUsed = Vec_IntStartNatural( Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vGias );
    }
    else
    {
        vFuncs = Acb_TransformPatchFunctions( vSops, vSupps, &vUsed, Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vFuncs );
    }

    // generate instance and patch
    vInst   = Acb_GenerateInstance( pNtkF, vDivs, vUsed, &pNtkF->vTargets );
    vPatch  = Acb_GeneratePatch( pNtkF, vDivs, vUsed, vFuncs, vGias, &pNtkF->vTargets );

    // print the results
    //printf( "%s", Vec_StrArray(vPatch) );
    Acb_PrintPatch( pNtkF, vDivs, vUsed, clk );

    // generate output files
    if ( pFileName[3] == NULL ) Acb_GenerateFilePatch( vPatch, "patch.v" );
    Acb_GenerateFileOut( vInst, pFileName[0], pFileName[3] ? pFileName[3] : (char *)"out.v", vPatch );
    printf( "Finished dumping resulting file \"%s\".\n\n", pFileName[3] ? pFileName[3] : "out.v" );
    //Gia_AigerWrite( pGiaG, "test.aig", 0, 0, 0 );
cleanup:
    // cleanup
    if ( vGias )
    {
        Gia_Man_t * pTemp; int i;
        Vec_PtrForEachEntry( Gia_Man_t *, vGias, pTemp, i )
            Gia_ManStop( pTemp );
        Vec_PtrFree( vGias );
    }
    Vec_StrFreeP( &vPatch );
    Vec_StrFreeP( &vInst );

    Vec_PtrFreeFree( vSops );
    Vec_WecFree( vSupps );
    Vec_IntFree( vSuppOld );
    Vec_IntFreeP( &vUsed );
    if ( vFuncs ) Vec_PtrFreeFree( vFuncs );

    Gia_ManStop( pGiaF );
    Gia_ManStop( pGiaG );
    Gia_ManStop( pGiaM );

    Vec_IntFreeP( &vSuppF );
    Vec_IntFreeP( &vSuppG );
    Vec_IntFreeP( &vSupp );
    Vec_IntFreeP( &vNodesF );
    Vec_IntFreeP( &vNodesG );
    Vec_IntFreeP( &vRoots );
    Vec_IntFreeP( &vDivs );
    Vec_BitFreeP( &vBlock );
    return RetValue;
}